

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::drawRotateHandles(XFormWidget *this)

{
  ulong uVar1;
  double dVar2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double __x;
  double dVar18;
  double local_f8;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    dVar6 = (this->center).x;
    dVar7 = (this->center).y;
    dVar4 = (this->bounds).max.x - (this->bounds).min.x;
    dVar16 = (this->bounds).max.y - (this->bounds).min.y;
    dVar2 = (this->center).z;
    dVar17 = (this->bounds).max.z - (this->bounds).min.z;
    dVar4 = SQRT(dVar17 * dVar17 + dVar4 * dVar4 + dVar16 * dVar16) * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    uVar12 = 0;
    while (uVar12 != 3) {
      uVar1 = uVar12 + 1;
      uVar13 = 0;
      if (uVar1 != 3) {
        uVar13 = uVar1 & 0xffffffff;
      }
      pVVar3 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar16 = pVVar3[uVar13].z;
      uVar15 = (ulong)((int)uVar12 - 1);
      if (uVar12 == 0) {
        uVar15 = 2;
      }
      dVar8 = pVVar3[uVar13].x;
      dVar9 = pVVar3[uVar13].y;
      dVar10 = pVVar3[uVar15].x;
      dVar11 = pVVar3[uVar15].y;
      dVar17 = pVVar3[uVar15].z;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      local_f8 = 0.0;
      for (iVar14 = 1; uVar12 = uVar1, iVar14 != 0x41; iVar14 = iVar14 + 1) {
        dVar18 = local_f8 * 6.283185307179586 * 0.015625;
        local_f8 = local_f8 + 1.0;
        __x = (double)iVar14 * 6.283185307179586 * 0.015625;
        dVar5 = cos(dVar18);
        dVar18 = sin(dVar18);
        local_38 = (dVar16 * dVar5 - dVar17 * dVar18) * dVar4 + dVar2;
        local_48 = (dVar5 * dVar8 - dVar18 * dVar10) * dVar4 + dVar6;
        dStack_40 = (dVar5 * dVar9 - dVar18 * dVar11) * dVar4 + dVar7;
        dVar5 = cos(__x);
        dVar18 = sin(__x);
        local_58 = (dVar16 * dVar5 - dVar17 * dVar18) * dVar4 + dVar2;
        local_68 = (dVar5 * dVar8 - dVar18 * dVar10) * dVar4 + dVar6;
        dStack_60 = (dVar5 * dVar9 - dVar18 * dVar11) * dVar4 + dVar7;
        glVertex3dv(&local_48);
        glVertex3dv(&local_68);
      }
    }
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawRotateHandles() const {
  const double boxSize = .2;
  const int nSides = 64;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D e1 = axes[(i + 1) % 3];
    Vector3D e2 = axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)(j + 0) / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;

      Vector3D q1 = c + r * (cos(theta1) * e1 - sin(theta1) * e2);
      Vector3D q2 = c + r * (cos(theta2) * e1 - sin(theta2) * e2);

      glVertex3dv(&q1.x);
      glVertex3dv(&q2.x);
    }
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}